

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_inspect(REF_MIGRATE ref_migrate)

{
  REF_NODE pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  if (0 < ref_migrate->max) {
    pRVar1 = ref_migrate->grid->node;
    lVar8 = 0;
    do {
      if (ref_migrate->global[lVar8] != -1) {
        lVar7 = -1;
        if ((lVar8 < pRVar1->max) && (lVar7 = pRVar1->global[lVar8], lVar7 < 0)) {
          lVar7 = -1;
        }
        printf(" %2d : %ld :",(ulong)(uint)pRVar1->ref_mpi->id,lVar7);
        pRVar2 = ref_migrate->parent_local;
        iVar6 = -1;
        uVar5 = 0xffffffff;
        if (lVar8 < pRVar2->nnode) {
          uVar5 = (ulong)(uint)pRVar2->first[lVar8];
        }
        if ((int)uVar5 != -1) {
          iVar6 = pRVar2->item[(int)uVar5].ref;
        }
        while (iVar4 = (int)uVar5, iVar4 != -1) {
          printf(" %ld+%d",ref_migrate->global[iVar6],
                 (ulong)(uint)ref_migrate->parent_part->item[iVar4].ref);
          pRVar3 = ref_migrate->parent_local->item;
          uVar5 = (ulong)pRVar3[iVar4].next;
          if (uVar5 == 0xffffffffffffffff) {
            iVar6 = -1;
          }
          else {
            iVar6 = pRVar3[uVar5].ref;
          }
        }
        putchar(10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < ref_migrate->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_inspect(REF_MIGRATE ref_migrate) {
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_INT node, item, local, part;
  REF_GLOB global;

  each_ref_migrate_node(ref_migrate, node) {
    printf(" %2d : " REF_GLOB_FMT " :", ref_mpi_rank(ref_node_mpi(ref_node)),
           ref_node_global(ref_node, node));
    each_ref_adj_node_item_with_ref(ref_migrate_parent_local(ref_migrate), node,
                                    item, local) {
      global = ref_migrate_global(ref_migrate, local);
      part = ref_adj_item_ref(ref_migrate_parent_part(ref_migrate), item);
      printf(" " REF_GLOB_FMT "+%d", global, part);
    }
    printf("\n");
  }
  return REF_SUCCESS;
}